

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

Connection
QMetaObject::connectImpl
          (QObject *sender,QMetaMethod *signal,QObject *receiver,void **slot,
          QSlotObjectBase *slotObjRaw,ConnectionType type)

{
  bool bVar1;
  MethodType MVar2;
  char *pcVar3;
  char *pcVar4;
  QSlotObjectBase *in_RCX;
  QMetaMethod *in_RDX;
  QObject *in_RSI;
  Connection *in_RDI;
  long in_FS_OFFSET;
  QMetaObject *senderMetaObject;
  int dummy;
  int signal_index;
  SlotObjUniquePtr slotObj;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffe80;
  QMetaMethod *in_stack_fffffffffffffe88;
  QMessageLogger *in_stack_fffffffffffffe90;
  QMetaMethod *in_stack_fffffffffffffe98;
  QObject *in_stack_fffffffffffffea0;
  Connection *pCVar5;
  int signal_index_00;
  QObject *in_stack_ffffffffffffff70;
  QMessageLogger local_78;
  undefined4 local_58;
  int local_54;
  QMessageLogger local_50;
  int type_00;
  int *in_stack_ffffffffffffffd8;
  QMetaObject *in_stack_ffffffffffffffe0;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  type_00 = -0x55555556;
  pCVar5 = in_RDI;
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_fffffffffffffe80,
             (pointer)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  signal_index_00 = (int)((ulong)pCVar5 >> 0x20);
  bVar1 = QMetaMethod::isValid(in_RDX);
  if ((bVar1) &&
     (MVar2 = QMetaMethod::methodType
                        ((QMetaMethod *)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),
     MVar2 == Signal)) {
    local_54 = -0x55555556;
    local_58 = 0xaaaaaaaa;
    QMetaObjectPrivate::memberIndexes
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(int *)in_stack_fffffffffffffe90,
               (int *)in_stack_fffffffffffffe88);
    (**in_RSI->_vptr_QObject)();
    if (local_54 == -1) {
      lcConnect();
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffe80,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffd8), bVar1) {
        anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f6e7c);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                   (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (char *)0x3f6e9c);
        QMetaMethod::methodSignature(in_stack_fffffffffffffe88);
        pcVar3 = QByteArray::constData((QByteArray *)0x3f6ec2);
        pcVar4 = className((QMetaObject *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        QMessageLogger::warning
                  (&local_78,"QObject::connect: Can\'t find signal %s on instance of class %s",
                   pcVar3,pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x3f6f0a);
      }
      Connection::Connection(in_RDI);
    }
    else {
      std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::release
                ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                 0x3f6f9f);
      in_stack_fffffffffffffe80 = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x0;
      QObjectPrivate::connectImpl
                (in_stack_ffffffffffffff70,signal_index_00,in_RSI,&in_RDX->mobj,in_RCX,type_00,
                 in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0);
    }
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffe80,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f6d2d);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                 (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char *)0x3f6d4d);
      QMessageLogger::warning(&local_50,"QObject::connect: invalid signal parameter");
      puStack_10 = (undefined1 *)((ulong)puStack_10 & 0xffffffffffffff00);
    }
    Connection::Connection(in_RDI);
  }
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_fffffffffffffe80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Connection)in_RDI;
}

Assistant:

QMetaObject::Connection QMetaObject::connectImpl(const QObject *sender, const QMetaMethod &signal,
                                             const QObject *receiver, void **slot,
                                             QtPrivate::QSlotObjectBase *slotObjRaw, Qt::ConnectionType type)
{
    QtPrivate::SlotObjUniquePtr slotObj(slotObjRaw);

    if (!signal.isValid() || signal.methodType() != QMetaMethod::Signal) {
        qCWarning(lcConnect, "QObject::connect: invalid signal parameter");
        return QMetaObject::Connection();
    }

    int signal_index;
    {
        int dummy;
        QMetaObjectPrivate::memberIndexes(sender, signal, &signal_index, &dummy);
    }

    const QMetaObject *senderMetaObject = sender->metaObject();
    if (signal_index == -1) {
        qCWarning(lcConnect, "QObject::connect: Can't find signal %s on instance of class %s",
                  signal.methodSignature().constData(), senderMetaObject->className());
        return QMetaObject::Connection();
    }

    return QObjectPrivate::connectImpl(sender, signal_index, receiver, slot, slotObj.release(), type, nullptr, senderMetaObject);
}